

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O3

void * retry_control_clone_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined4 *puVar3;
  char *pcVar4;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar4 = "Failed to clone option (either name (%p) or value (%p) are NULL)";
    iVar1 = 0x2f;
  }
  else {
    iVar1 = strcmp("initial_wait_time_in_secs",name);
    if ((iVar1 == 0) || (iVar1 = strcmp("max_jitter_percent",name), iVar1 == 0)) {
      puVar3 = (undefined4 *)malloc(4);
      if (puVar3 != (undefined4 *)0x0) {
        *puVar3 = *value;
        return puVar3;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return (void *)0x0;
      }
      pcVar4 = "Failed to clone option \'%p\' (malloc failed)";
      iVar1 = 0x39;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return (void *)0x0;
      }
      pcVar4 = "Failed to clone option (option with name \'%s\' is not suppported)";
      iVar1 = 0x45;
    }
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
            ,"retry_control_clone_option",iVar1,1,pcVar4,name);
  return (void *)0x0;
}

Assistant:

static void* retry_control_clone_option(const char* name, const void* value)
{
    void* result;

    if ((name == NULL) || (value == NULL))
    {
        LogError("Failed to clone option (either name (%p) or value (%p) are NULL)", name, value);
        result = NULL;
    }
    else if (strcmp(RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, name) == 0 ||
            strcmp(RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT, name) == 0)
    {
        unsigned int* cloned_value;

        if ((cloned_value = (unsigned int*)malloc(sizeof(unsigned int))) == NULL)
        {
            LogError("Failed to clone option '%p' (malloc failed)", name);
            result = NULL;
        }
        else
        {
            *cloned_value = *(unsigned int*)value;

            result = (void*)cloned_value;
        }
    }
    else
    {
        LogError("Failed to clone option (option with name '%s' is not suppported)", name);
        result = NULL;
    }

    return result;
}